

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Ok> *
wasm::WATParser::makeResumeThrow<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  __index_type *p_Var3;
  __index_type *__rhs;
  undefined1 local_f8 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> type;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_b0;
  undefined1 auStack_a8 [8];
  Result<wasm::Name> exnTag;
  Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
  _val_2;
  Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
  resumetable;
  
  local_b0 = annotations;
  typeidx<wasm::WATParser::ParseDefsCtx>
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT> *)
             local_f8,ctx);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     *)auStack_a8,
                    (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                     *)local_f8);
  if (exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&resumetable.val.
                     super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
             + 8);
    _val_2.val.
    super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
    .super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>.
    super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
    ._32_8_ = puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val_2.val.
                       super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
               + 0x20),auStack_a8,
               exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._M_first._M_storage.
               super_IString.str._M_len + (long)auStack_a8);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
    if ((undefined1 *)
        _val_2.val.
        super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
        .
        super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .
        super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .
        super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        ._32_8_ == puVar1) {
      *puVar2 = resumetable.val.
                super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                .
                super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                .
                super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                .
                super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                .
                super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                .
                super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                ._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           resumetable.val.
           super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           ._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           _val_2.val.
           super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           ._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           resumetable.val.
           super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           ._M_u._8_8_;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
         resumetable.val.
         super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
         .
         super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
         .
         super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
         .
         super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
         .
         super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
         .
         super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
         ._M_u._0_8_;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         *)auStack_a8);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                         *)auStack_a8);
    tagidx<wasm::WATParser::ParseDefsCtx>((Result<wasm::Name> *)auStack_a8,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)
               ((long)&_val_2.val.
                       super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
               + 0x20),(_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)auStack_a8);
    if (resumetable.val.
        super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
        .
        super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .
        super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        .
        super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      puVar1 = (undefined1 *)
               ((long)&_val_2.val.
                       super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
               + 8);
      exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ = puVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                         super__Move_assign_alias<wasm::Name,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
                 _val_2.val.
                 super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 ._32_8_,resumetable.val.
                         super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         ._M_u._0_8_ +
                         _val_2.val.
                         super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         ._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      if ((undefined1 *)
          exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
          super__Move_assign_alias<wasm::Name,_wasm::Err>.
          super__Copy_assign_alias<wasm::Name,_wasm::Err>.
          super__Move_ctor_alias<wasm::Name,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
          super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ == puVar1) {
        *puVar2 = _val_2.val.
                  super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                  .
                  super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                  .
                  super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                  .
                  super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                  .
                  super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                  .
                  super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                  ._M_u._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
             _val_2.val.
             super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
             .
             super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
             .
             super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
             .
             super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
             .
             super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
             ._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
             super__Move_assign_alias<wasm::Name,_wasm::Err>.
             super__Copy_assign_alias<wasm::Name,_wasm::Err>.
             super__Move_ctor_alias<wasm::Name,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
             super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             _val_2.val.
             super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
             .
             super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
             .
             super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
             .
             super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
             .
             super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
             .
             super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
             ._M_u._8_8_;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
           _val_2.val.
           super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
           .
           super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           .
           super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
           ._M_u._0_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
                 ((long)&_val_2.val.
                         super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
                 ((long)&_val_2.val.
                         super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                 + 0x20));
      makeResumeTable<wasm::WATParser::ParseDefsCtx>
                ((Result<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>_>
                  *)((long)&_val_2.val.
                            super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                    + 0x20),ctx);
      __rhs = (__index_type *)
              ((long)&_val_2.val.
                      super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
              + 0x20);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         *)((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
                        (_Copy_ctor_base<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                         *)__rhs);
      if (_val_2.val.
          super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          .
          super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          .
          super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          .
          super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
          ._M_u._24_1_ == '\x01') {
        type.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
        ._32_8_ = &local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&type.val.
                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                   + 0x20),exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                           super__Move_assign_alias<wasm::Name,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_,
                   _val_2.val.
                   super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                   .
                   super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                   .
                   super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                   .
                   super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                   .
                   super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                   .
                   super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                   ._M_u._0_8_ +
                   exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                   super__Move_assign_alias<wasm::Name,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
        if ((undefined8 *)
            type.val.
            super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
            ._32_8_ == &local_c0) {
          *puVar2 = local_c0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_b8;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
               type.val.
               super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
               ._32_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_c0;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_c8;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                             *)((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                             *)((long)&exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
        p_Var3 = auStack_a8;
        if (exnTag.val.super__Variant_base<wasm::Name,_wasm::Err>.
            super__Move_assign_alias<wasm::Name,_wasm::Err>.
            super__Copy_assign_alias<wasm::Name,_wasm::Err>.
            super__Move_ctor_alias<wasm::Name,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
            super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ != '\0') {
          p_Var3 = (__index_type *)0x0;
        }
        if (resumetable.val.
            super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
            .
            super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
            .
            super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
            .
            super__Variant_storage_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
            ._M_u._24_1_ != '\0') {
          __rhs = (__index_type *)0x0;
        }
        ParseDefsCtx::makeResumeThrow
                  (__return_storage_ptr__,ctx,pos,local_b0,(HeapType)local_f8,
                   (IString)*(IString *)p_Var3,
                   (vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>
                    *)__rhs);
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                           *)((long)&_val_2.val.
                                     super__Variant_base<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::OnClauseInfo>_>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::vector<wasm::WATParser::ParseDefsCtx::OnClauseInfo>,_wasm::Err>
                             + 0x20));
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)auStack_a8);
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::HeapTypeT,_wasm::Err>
                       *)local_f8);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeResumeThrow(Ctx& ctx,
                         Index pos,
                         const std::vector<Annotation>& annotations) {
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  auto exnTag = tagidx(ctx);
  CHECK_ERR(exnTag);

  auto resumetable = makeResumeTable(ctx);
  CHECK_ERR(resumetable);

  return ctx.makeResumeThrow(pos, annotations, *type, *exnTag, *resumetable);
}